

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void stat4Destructor(void *pOld)

{
  long lVar1;
  void *pvVar2;
  long lVar3;
  long lVar4;
  
  if (0 < *(int *)((long)pOld + 8)) {
    lVar3 = 0x20;
    lVar4 = 0;
    do {
      lVar1 = *(long *)((long)pOld + 0x50);
      if (*(int *)(lVar1 + lVar3) != 0) {
        pvVar2 = *(void **)(lVar1 + -8 + lVar3);
        if (pvVar2 != (void *)0x0) {
          sqlite3DbFreeNN(*(sqlite3 **)((long)pOld + 0x70),pvVar2);
        }
        *(undefined4 *)(lVar1 + lVar3) = 0;
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x30;
    } while (lVar4 < *(int *)((long)pOld + 8));
  }
  if (0 < *(int *)((long)pOld + 0x10)) {
    lVar3 = 0x20;
    lVar4 = 0;
    do {
      lVar1 = *(long *)((long)pOld + 0x68);
      if (*(int *)(lVar1 + lVar3) != 0) {
        pvVar2 = *(void **)(lVar1 + -8 + lVar3);
        if (pvVar2 != (void *)0x0) {
          sqlite3DbFreeNN(*(sqlite3 **)((long)pOld + 0x70),pvVar2);
        }
        *(undefined4 *)(lVar1 + lVar3) = 0;
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x30;
    } while (lVar4 < *(int *)((long)pOld + 0x10));
  }
  if (*(int *)((long)pOld + 0x38) != 0) {
    if (*(void **)((long)pOld + 0x30) != (void *)0x0) {
      sqlite3DbFreeNN(*(sqlite3 **)((long)pOld + 0x70),*(void **)((long)pOld + 0x30));
    }
    *(undefined4 *)((long)pOld + 0x38) = 0;
  }
  if (pOld != (void *)0x0) {
    sqlite3DbFreeNN(*(sqlite3 **)((long)pOld + 0x70),pOld);
    return;
  }
  return;
}

Assistant:

static void stat4Destructor(void *pOld){
  Stat4Accum *p = (Stat4Accum*)pOld;
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
  int i;
  for(i=0; i<p->nCol; i++) sampleClear(p->db, p->aBest+i);
  for(i=0; i<p->mxSample; i++) sampleClear(p->db, p->a+i);
  sampleClear(p->db, &p->current);
#endif
  sqlite3DbFree(p->db, p);
}